

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O2

int compare_list(char **name,void **l,zip_uint64_t *n,int size,_func_int_void_ptr_void_ptr *cmp,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_void_ptr *print)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint local_48 [2];
  void **local_40;
  _func_int_char_ptr_ptr_void_ptr_void_ptr *local_38;
  
  local_40 = l + 1;
  uVar6 = (ulong)(uint)size;
  uVar9 = 0;
  uVar4 = 0;
  uVar7 = 0;
  local_38 = check;
  while( true ) {
    uVar5 = (uint)uVar4;
    iVar8 = (int)uVar9;
    if ((*n <= uVar4) || (n[1] <= uVar9)) break;
    iVar1 = (*cmp)(*l,l[1]);
    ppvVar3 = local_40;
    if (iVar1 == 0) {
      if (local_38 != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
        uVar2 = (*local_38)(name,*l,l[1]);
        uVar7 = uVar7 | uVar2;
      }
      *l = (void *)((long)*l + uVar6);
      uVar4 = (ulong)(uVar5 + 1);
      uVar9 = (ulong)(iVar8 + 1);
      ppvVar3 = local_40;
    }
    else if (iVar1 < 0) {
      if (verbose != 0 && header_done == 0) {
        printf("--- %s\n+++ %s\n",*name,name[1]);
        header_done = 1;
      }
      if (verbose != 0) {
        printf("%c ",0x2d);
        (*print)(*l);
      }
      uVar4 = (ulong)(uVar5 + 1);
      uVar7 = 1;
      ppvVar3 = l;
    }
    else {
      if (verbose != 0 && header_done == 0) {
        printf("--- %s\n+++ %s\n",*name,name[1]);
        header_done = 1;
      }
      if (verbose != 0) {
        printf("%c ",0x2b);
        (*print)(*ppvVar3);
      }
      uVar9 = (ulong)(iVar8 + 1);
      uVar7 = 1;
    }
    *ppvVar3 = (void *)((long)*ppvVar3 + uVar6);
  }
  local_48[0] = uVar5;
  local_48[1] = iVar8;
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    for (uVar5 = local_48[lVar10]; (ulong)uVar5 < n[lVar10]; uVar5 = uVar5 + 1) {
      if (verbose != 0 && header_done == 0) {
        printf("--- %s\n+++ %s\n",*name,name[1]);
        header_done = 1;
      }
      if (verbose != 0) {
        printf("%c ",(ulong)((uint)(lVar10 == 0) * 2 + 0x2b));
        (*print)(l[lVar10]);
      }
      l[lVar10] = (void *)((long)l[lVar10] + uVar6);
      uVar7 = 1;
    }
    local_48[lVar10] = uVar5;
  }
  return uVar7;
}

Assistant:

static int
compare_list(char *const name[2], const void *l[2], const zip_uint64_t n[2], int size, int (*cmp)(const void *, const void *), int (*check)(char *const name[2], const void *, const void *), void (*print)(const void *)) {
    unsigned int i[2];
    int j, c;
    int diff;

#define INC(k) (i[k]++, l[k] = ((const char *)l[k]) + size)
#define PRINT(k)                                          \
    do {                                                  \
	if (header_done == 0 && verbose) {                \
	    printf("--- %s\n+++ %s\n", name[0], name[1]); \
	    header_done = 1;                              \
	}                                                 \
	if (verbose) {                                    \
	    printf("%c ", (k) ? '+' : '-');               \
	    print(l[k]);                                  \
	}                                                 \
	diff = 1;                                         \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < n[0] && i[1] < n[1]) {
	c = cmp(l[0], l[1]);

	if (c == 0) {
	    if (check)
		diff |= check(name, l[0], l[1]);
	    INC(0);
	    INC(1);
	}
	else if (c < 0) {
	    PRINT(0);
	    INC(0);
	}
	else {
	    PRINT(1);
	    INC(1);
	}
    }

    for (j = 0; j < 2; j++) {
	while (i[j] < n[j]) {
	    PRINT(j);
	    INC(j);
	}
    }

    return diff;
}